

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall TTD::SlabAllocatorBase<8>::~SlabAllocatorBase(SlabAllocatorBase<8> *this)

{
  SlabBlock *pSVar1;
  LargeSlabBlock *pLVar2;
  LargeSlabBlock *tmp_1;
  LargeSlabBlock *currLargeBlock;
  SlabBlock *tmp;
  SlabBlock *currBlock;
  SlabAllocatorBase<8> *this_local;
  
  tmp = this->m_headBlock;
  while (tmp != (SlabBlock *)0x0) {
    pSVar1 = tmp->Previous;
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)this->m_slabBlockSize,(uchar *)tmp);
    tmp = pSVar1;
  }
  tmp_1 = this->m_largeBlockList;
  while (tmp_1 != (LargeSlabBlock *)0x0) {
    pLVar2 = tmp_1->Previous;
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)tmp_1->TotalBlockSize,(uchar *)tmp_1);
    tmp_1 = pLVar2;
  }
  if (this->m_reserveActiveLargeBlock != (LargeSlabBlock *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)this->m_reserveActiveBytes,
               (uchar *)this->m_reserveActiveLargeBlock);
    this->m_reserveActiveLargeBlock = (LargeSlabBlock *)0x0;
  }
  return;
}

Assistant:

~SlabAllocatorBase()
        {
            SlabBlock* currBlock = this->m_headBlock;
            while (currBlock != nullptr)
            {
                SlabBlock* tmp = currBlock;
                currBlock = currBlock->Previous;

                TT_HEAP_FREE_ARRAY(byte, (byte*)tmp, this->m_slabBlockSize);
            }

            LargeSlabBlock* currLargeBlock = this->m_largeBlockList;
            while (currLargeBlock != nullptr)
            {
                LargeSlabBlock* tmp = currLargeBlock;
                currLargeBlock = currLargeBlock->Previous;

                TT_HEAP_FREE_ARRAY(byte, (byte*)tmp, tmp->TotalBlockSize);
            }

            if (this->m_reserveActiveLargeBlock != nullptr)
            {
                TT_HEAP_FREE_ARRAY(byte, (byte*)this->m_reserveActiveLargeBlock, this->m_reserveActiveBytes);
                this->m_reserveActiveLargeBlock = nullptr;
            }
        }